

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kgc.cpp
# Opt level: O3

void __thiscall Kgc::sweep(Kgc *this)

{
  Value *unreached;
  Value **ppVVar1;
  Value *local_28;
  
  local_28 = this->firstObject_;
  if (local_28 != (Value *)0x0) {
    ppVVar1 = &this->firstObject_;
    do {
      if (local_28->marked_ == 0) {
        *ppVVar1 = local_28->next_;
        this->numObjects_ = this->numObjects_ - 1;
        std::vector<Value*,std::allocator<Value*>>::emplace_back<Value*>
                  ((vector<Value*,std::allocator<Value*>> *)(this->reserved + (int)local_28->type_),
                   &local_28);
      }
      else {
        local_28->marked_ = 0;
        ppVVar1 = &local_28->next_;
      }
      local_28 = *ppVVar1;
    } while (local_28 != (Value *)0x0);
  }
  return;
}

Assistant:

void Kgc::sweep()
{
    const Value **object = &firstObject_;
    while (*object)
    {
        if (!(*object)->marked_)
        {
            const Value *unreached = *object;
            *object = unreached->next_;
            dealloc(unreached);
        } else
        {
            (*object)->marked_ = 0;
            object = (const Value **)&(*object)->next_;
        }
    }
}